

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall
CVmObject::set_index_val_ov
          (CVmObject *this,vm_val_t *new_container,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_val_t vself;
  
  iVar4 = (*this->_vptr_CVmObject[0x28])();
  pvVar3 = sp_;
  if (iVar4 == 0) {
    vself.typ = VM_OBJ;
    uVar2 = *(undefined4 *)&new_val->field_0x4;
    aVar1 = new_val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = new_val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    pvVar3 = sp_;
    uVar2 = *(undefined4 *)&index_val->field_0x4;
    aVar1 = index_val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = index_val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    vself.val.obj = self;
    CVmRun::op_overload(&G_interpreter_X,0,-1,&vself,G_predef_X.operator_setidx,2,0x7de);
    aVar1 = r0_.val;
    uVar2 = r0_._4_4_;
    new_container->typ = r0_.typ;
    *(undefined4 *)&new_container->field_0x4 = uVar2;
    new_container->val = aVar1;
  }
  return;
}

Assistant:

void CVmObject::set_index_val_ov(VMG_ vm_val_t *new_container,
                                 vm_obj_id_t self,
                                 const vm_val_t *index_val,
                                 const vm_val_t *new_val)
{
    /* try the native indexing first */
    if (!set_index_val_q(vmg_ new_container, self, index_val, new_val))
    {
        /* no native indexing - try the operator[]= overload */
        vm_val_t vself;
        vself.set_obj(self);
        G_stk->push(new_val);
        G_stk->push(index_val);
        G_interpreter->op_overload(vmg_ 0, -1,
                                   &vself, G_predef->operator_setidx,
                                   2, VMERR_CANNOT_INDEX_TYPE);

        /* return the new container result from R0 */
        *new_container = *G_interpreter->get_r0();
    }
}